

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

_Bool trans_INSR_f(DisasContext_conflict1 *s,arg_rrr_esz *a)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr arg2;
  _Bool _Var1;
  int iVar2;
  TCGv_i64 ret;
  TCGv_i64 t;
  TCGContext_conflict1 *tcg_ctx;
  arg_rrr_esz *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (_Var1) {
    ret = tcg_temp_new_i64(tcg_ctx_00);
    arg2 = tcg_ctx_00->cpu_env;
    iVar2 = vec_reg_offset(s,a->rm,0,MO_64);
    tcg_gen_ld_i64_aarch64(tcg_ctx_00,ret,arg2,(long)iVar2);
    do_insr_i64(s,a,ret);
    tcg_temp_free_i64(tcg_ctx_00,ret);
  }
  return true;
}

Assistant:

static bool trans_INSR_f(DisasContext *s, arg_rrr_esz *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (sve_access_check(s)) {
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_ld_i64(tcg_ctx, t, tcg_ctx->cpu_env, vec_reg_offset(s, a->rm, 0, MO_64));
        do_insr_i64(s, a, t);
        tcg_temp_free_i64(tcg_ctx, t);
    }
    return true;
}